

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

int png_write_image_8bit(png_voidp argument)

{
  ushort uVar1;
  int iVar2;
  undefined8 *puVar3;
  png_structrp png_ptr;
  png_const_bytep row;
  png_byte pVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  png_const_bytep ppVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  
  puVar3 = *argument;
  lVar11 = *(long *)((long)argument + 0x28);
  png_ptr = *(png_structrp *)*puVar3;
  row = *(png_const_bytep *)((long)argument + 0x38);
  iVar10 = *(int *)(puVar3 + 2);
  uVar8 = *(uint *)((long)puVar3 + 0x14);
  uVar14 = (ulong)(uVar8 & 2) + 1;
  if ((uVar8 & 1) == 0) {
    iVar2 = *(int *)((long)puVar3 + 0xc);
    while (bVar16 = iVar10 != 0, iVar10 = iVar10 + -1, bVar16) {
      for (lVar7 = 0; row + lVar7 < row + (uint)((int)uVar14 * iVar2); lVar7 = lVar7 + 1) {
        uVar8 = (uint)*(ushort *)(lVar11 + lVar7 * 2) * 0xff;
        uVar12 = uVar8 >> 0xf;
        row[lVar7] = (png_byte)
                     (((uint)png_sRGB_delta[uVar12] * (uVar8 & 0x7fff) >> 0xc) +
                      (uint)png_sRGB_base[uVar12] >> 8);
      }
      png_write_row(png_ptr,row);
      lVar11 = lVar11 + (ulong)(*(uint *)((long)argument + 0x30) & 0xfffe);
    }
  }
  else {
    uVar12 = uVar8 & 0x20;
    uVar14 = -(ulong)(uVar12 != 0) | uVar14;
    lVar11 = lVar11 + (ulong)(uVar12 >> 4);
    iVar13 = (uVar8 & 2) + 2;
    iVar2 = *(int *)((long)puVar3 + 0xc);
    while (bVar16 = iVar10 != 0, iVar10 = iVar10 + -1, ppVar9 = row + (uVar12 >> 5), lVar7 = lVar11,
          bVar16) {
      while (ppVar9 < row + (uVar12 >> 5) + (uint)(iVar2 * iVar13)) {
        uVar1 = *(ushort *)(lVar7 + uVar14 * 2);
        uVar5 = (uint)uVar1 * 0xff + 0x807f;
        uVar8 = 0;
        uVar6 = uVar5 >> 0x10;
        ppVar9[uVar14] = (png_byte)(uVar5 >> 0x10);
        if ((uVar6 != 0) && (uVar6 != 0xff)) {
          uVar8 = ((uVar1 >> 1) + 0x7f7f8080) / (uint)uVar1;
        }
        lVar7 = lVar7 + 2;
        ppVar9 = ppVar9 + 1;
        iVar15 = iVar13;
        do {
          pVar4 = png_unpremultiply((uint)*(ushort *)(lVar7 + -2),(uint)uVar1,uVar8);
          ppVar9[-1] = pVar4;
          lVar7 = lVar7 + 2;
          ppVar9 = ppVar9 + 1;
          iVar15 = iVar15 + -1;
        } while (1 < iVar15);
      }
      png_write_row(png_ptr,*(png_const_bytep *)((long)argument + 0x38));
      lVar11 = lVar11 + (ulong)(*(uint *)((long)argument + 0x30) & 0xfffe);
    }
  }
  return 1;
}

Assistant:

static int
png_write_image_8bit(png_voidp argument)
{
   png_image_write_control *display = png_voidcast(png_image_write_control*,
       argument);
   png_imagep image = display->image;
   png_structrp png_ptr = image->opaque->png_ptr;

   png_const_uint_16p input_row = png_voidcast(png_const_uint_16p,
       display->first_row);
   png_bytep output_row = png_voidcast(png_bytep, display->local_row);
   png_uint_32 y = image->height;
   unsigned int channels = (image->format & PNG_FORMAT_FLAG_COLOR) != 0 ?
       3 : 1;

   if ((image->format & PNG_FORMAT_FLAG_ALPHA) != 0)
   {
      png_bytep row_end;
      int aindex;

#   ifdef PNG_SIMPLIFIED_WRITE_AFIRST_SUPPORTED
      if ((image->format & PNG_FORMAT_FLAG_AFIRST) != 0)
      {
         aindex = -1;
         ++input_row; /* To point to the first component */
         ++output_row;
      }

      else
#   endif
      aindex = (int)channels;

      /* Use row_end in place of a loop counter: */
      row_end = output_row + image->width * (channels+1);

      for (; y > 0; --y)
      {
         png_const_uint_16p in_ptr = input_row;
         png_bytep out_ptr = output_row;

         while (out_ptr < row_end)
         {
            png_uint_16 alpha = in_ptr[aindex];
            png_byte alphabyte = (png_byte)PNG_DIV257(alpha);
            png_uint_32 reciprocal = 0;
            int c;

            /* Scale and write the alpha channel. */
            out_ptr[aindex] = alphabyte;

            if (alphabyte > 0 && alphabyte < 255)
               reciprocal = UNP_RECIPROCAL(alpha);

            c = (int)channels;
            do /* always at least one channel */
               *out_ptr++ = png_unpremultiply(*in_ptr++, alpha, reciprocal);
            while (--c > 0);

            /* Skip to next component (skip the intervening alpha channel) */
            ++in_ptr;
            ++out_ptr;
         } /* while out_ptr < row_end */

         png_write_row(png_ptr, png_voidcast(png_const_bytep,
             display->local_row));
         input_row += (png_uint_16)display->row_bytes/(sizeof (png_uint_16));
      } /* while y */
   }

   else
   {
      /* No alpha channel, so the row_end really is the end of the row and it
       * is sufficient to loop over the components one by one.
       */
      png_bytep row_end = output_row + image->width * channels;

      for (; y > 0; --y)
      {
         png_const_uint_16p in_ptr = input_row;
         png_bytep out_ptr = output_row;

         while (out_ptr < row_end)
         {
            png_uint_32 component = *in_ptr++;

            component *= 255;
            *out_ptr++ = (png_byte)PNG_sRGB_FROM_LINEAR(component);
         }

         png_write_row(png_ptr, output_row);
         input_row += (png_uint_16)display->row_bytes/(sizeof (png_uint_16));
      }
   }

   return 1;
}